

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall despot::Parser::ParseDiscountTag(Parser *this,TiXmlHandle *xml_handle)

{
  int iVar1;
  TiXmlElement *this_00;
  char *__s;
  log_ostream *plVar2;
  ostream *poVar3;
  string discount_str;
  TiXmlHandle local_90;
  TiXmlHandle local_88 [4];
  double local_68;
  undefined8 uStack_60;
  string local_58;
  string local_38;
  
  util::tinyxml::TiXmlHandle::FirstChild(&local_90,(char *)xml_handle);
  util::tinyxml::TiXmlHandle::FirstChild(local_88,(char *)&local_90);
  this_00 = util::tinyxml::TiXmlHandle::ToElement(local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Cannot find Discount tag",(allocator<char> *)local_88);
  Ensure(this,this_00 != (TiXmlElement *)0x0,&local_38,(TiXmlBase *)0x0);
  std::__cxx11::string::~string((string *)&local_38);
  __s = util::tinyxml::TiXmlElement::GetText(this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,__s,(allocator<char> *)&local_90);
  DAT_0019fdd8 = atof((char *)local_88[0].node);
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar2 = logging::stream(3);
      std::operator<<(&plVar2->super_ostream,"Discount = ");
      poVar3 = std::ostream::_M_insert<double>(DAT_0019fdd8);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  local_68 = DAT_0019fdd8;
  uStack_60 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Discount factor must be in (0, 1).",(allocator<char> *)&local_90);
  Ensure(this,(bool)(-(local_68 < 1.0) & -(0.0 < local_68) & 1),&local_58,(TiXmlBase *)this_00);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)local_88);
  return;
}

Assistant:

void Parser::ParseDiscountTag(TiXmlHandle& xml_handle) {
	TiXmlElement* e_Discount = xml_handle.FirstChild("pomdpx").FirstChild(
		"Discount").ToElement();

	Ensure(e_Discount != NULL, "Cannot find Discount tag");

	string discount_str = e_Discount->GetText();
	Globals::config.discount = atof(discount_str.c_str());
	logi << "Discount = " << Globals::config.discount << endl;

	Ensure(Globals::config.discount < 1.0 && Globals::config.discount > 0,
		"Discount factor must be in (0, 1).", e_Discount);
}